

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# packet_impl.h
# Opt level: O0

void __thiscall packet::PacketT<TestConfig>::setupState(PacketT<TestConfig> *this,State state)

{
  uint32_t uVar1;
  uint *puVar2;
  undefined4 in_ESI;
  undefined4 *in_RDI;
  undefined7 local_b0;
  undefined1 in_stack_ffffffffffffff57;
  size_t in_stack_ffffffffffffff58;
  size_t in_stack_ffffffffffffff60;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_stack_ffffffffffffff68;
  BufferPart *in_stack_ffffffffffffff70;
  undefined8 local_88;
  undefined8 local_80;
  undefined8 local_78;
  undefined8 local_70;
  undefined8 local_68;
  undefined8 local_60;
  undefined8 local_58;
  undefined8 local_50;
  undefined8 local_48;
  undefined8 local_40;
  undefined8 local_38;
  undefined8 local_30;
  undefined8 local_28;
  undefined8 local_20;
  undefined8 local_18;
  
  *in_RDI = in_ESI;
  switch(*in_RDI) {
  case 0:
    BufferPart::BufferPart
              (in_stack_ffffffffffffff70,in_stack_ffffffffffffff68,in_stack_ffffffffffffff60,
               in_stack_ffffffffffffff58,(bool)in_stack_ffffffffffffff57);
    *(undefined8 *)(in_RDI + 8) = local_30;
    *(undefined8 *)(in_RDI + 10) = local_28;
    *(undefined8 *)(in_RDI + 0xc) = local_20;
    *(undefined8 *)(in_RDI + 0xe) = local_18;
    break;
  case 1:
    BufferPart::BufferPart
              (in_stack_ffffffffffffff70,in_stack_ffffffffffffff68,in_stack_ffffffffffffff60,
               in_stack_ffffffffffffff58,(bool)in_stack_ffffffffffffff57);
    *(undefined8 *)(in_RDI + 8) = local_50;
    *(undefined8 *)(in_RDI + 10) = local_48;
    *(undefined8 *)(in_RDI + 0xc) = local_40;
    *(undefined8 *)(in_RDI + 0xe) = local_38;
    break;
  case 2:
    puVar2 = BufferPart::parseAs<unsigned_int>((BufferPart *)0x109ceb);
    uVar1 = ntohl(*puVar2);
    in_RDI[0x10] = uVar1;
    BufferPart::BufferPart
              (in_stack_ffffffffffffff70,in_stack_ffffffffffffff68,in_stack_ffffffffffffff60,
               in_stack_ffffffffffffff58,(bool)in_stack_ffffffffffffff57);
    *(undefined8 *)(in_RDI + 8) = local_70;
    *(undefined8 *)(in_RDI + 10) = local_68;
    *(undefined8 *)(in_RDI + 0xc) = local_60;
    *(undefined8 *)(in_RDI + 0xe) = local_58;
    break;
  case 3:
    BufferPart::BufferPart
              (in_stack_ffffffffffffff70,in_stack_ffffffffffffff68,in_stack_ffffffffffffff60,
               in_stack_ffffffffffffff58,(bool)in_stack_ffffffffffffff57);
    *(BufferPart **)(in_RDI + 8) = in_stack_ffffffffffffff70;
    *(undefined8 *)(in_RDI + 10) = local_88;
    *(undefined8 *)(in_RDI + 0xc) = local_80;
    *(undefined8 *)(in_RDI + 0xe) = local_78;
    break;
  case 4:
    BufferPart::BufferPart((BufferPart *)&local_b0);
    *(ulong *)(in_RDI + 8) = CONCAT17(in_stack_ffffffffffffff57,local_b0);
    *(size_t *)(in_RDI + 10) = in_stack_ffffffffffffff58;
    *(size_t *)(in_RDI + 0xc) = in_stack_ffffffffffffff60;
    *(vector<unsigned_char,_std::allocator<unsigned_char>_> **)(in_RDI + 0xe) =
         in_stack_ffffffffffffff68;
  }
  return;
}

Assistant:

inline void
PacketT<Cfg>::setupState(const State state)
{
  reading_state_ = state;
  switch (reading_state_) {
    case State::HEAD_PATTERN: {
      buffer_part_ = BufferPart(&buffer_, 0, HEAD_PATTERN_SIZE);
      break;
    }
    case State::DATA_SIZE: {
      buffer_part_ = BufferPart(&buffer_, current_data_idx_, sizeof(data_len_t));
      break;
    }
    case State::DATA: {
      pkt_data_len_ = ntohl((*buffer_part_.parseAs<data_len_t>()));
      buffer_part_ = BufferPart(&buffer_, current_data_idx_, pkt_data_len_);
      break;
    }
    case State::TAIL_PATTERN: {
      buffer_part_ = BufferPart(&buffer_, current_data_idx_, TAIL_PATTERN_SIZE);
      break;
    }
    case State::NONE: {
      buffer_part_ = BufferPart();
      break;
    }
  }
}